

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O3

void UI::execute_silver_linings(string *mesh_in,string *geo_out)

{
  pointer pcVar1;
  int iVar2;
  clock_t cVar3;
  clock_t cVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  cVar3 = clock();
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"See logfile.txt for conversion information","");
  print_ln(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "=================================== START ==================================","");
  print_ln(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "-------------------------------- CONVERTING... -----------------------------","");
  print_ln(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (mesh_in->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + mesh_in->_M_string_length);
  pcVar1 = (geo_out->_M_dataplus)._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + geo_out->_M_string_length);
  iVar2 = begin_processing(&local_f0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 == 0) {
    cVar4 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Program execution took ",0x17);
    poVar5 = std::ostream::_M_insert<double>((double)((float)(cVar4 - cVar3) / 1e+06));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," seconds",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    paVar7 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "============================== CONVERSION END ==============================","");
    print_ln(&local_70);
    _Var6._M_p = local_70._M_dataplus._M_p;
  }
  else {
    paVar7 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Error: Conversion failed. See logfile.txt for why.","");
    print_ln(&local_50);
    _Var6._M_p = local_50._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar7) {
    operator_delete(_Var6._M_p,paVar7->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UI::execute_silver_linings(std::string mesh_in, std::string geo_out)
{
    clock_t execution_time;
    execution_time = clock();
    print_ln("See logfile.txt for conversion information");
    print_ln("=================================== START ==================================");
    print_ln("-------------------------------- CONVERTING... -----------------------------");
    int outcome = begin_processing(mesh_in, geo_out);
    if (outcome!=0)
    {
        print_ln("Error: Conversion failed. See logfile.txt for why.");
    }
    else
    {
        execution_time = clock() - execution_time;
        std::cout << "Program execution took "
        << (float)execution_time / CLOCKS_PER_SEC
        << " seconds" << std::endl;
        print_ln("============================== CONVERSION END ==============================");
    }
}